

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O1

int VP8LCreateCompressedHuffmanTree(HuffmanTreeCode *tree,HuffmanTreeToken *tokens,int max_tokens)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  HuffmanTreeToken *__s;
  uint8_t uVar12;
  uint8_t uVar13;
  HuffmanTreeToken *pHVar14;
  
  iVar1 = tree->num_symbols;
  pHVar14 = tokens;
  if (0 < (long)iVar1) {
    iVar10 = 0;
    uVar12 = '\b';
    do {
      lVar11 = (long)iVar10;
      uVar13 = tree->code_lengths[lVar11];
      iVar8 = iVar10;
      iVar3 = iVar10 + 1;
      if (iVar10 + 1 < iVar1) {
        iVar3 = iVar1;
      }
      do {
        lVar11 = lVar11 + 1;
        iVar9 = iVar3;
        if (iVar1 <= lVar11) break;
        iVar9 = iVar8 + 1;
        iVar8 = iVar9;
      } while (tree->code_lengths[lVar11] == uVar13);
      iVar3 = iVar9 - iVar10;
      if (uVar13 == '\0') {
        uVar13 = uVar12;
        if (0 < iVar3) {
          __s = pHVar14;
          if (2 < iVar3) {
            cVar4 = -0xb - (char)iVar10;
            cVar6 = -3 - (char)iVar10;
            iVar10 = -iVar10;
            do {
              if (iVar10 + iVar9 < 0xb) {
                __s->code = '\x11';
                __s->extra_bits = cVar6 + (char)iVar9;
LAB_0017047c:
                pHVar14 = __s + 1;
                goto LAB_00170462;
              }
              __s->code = '\x12';
              if (iVar10 + iVar9 < 0x8b) {
                __s->extra_bits = cVar4 + (char)iVar9;
                goto LAB_0017047c;
              }
              __s->extra_bits = '\x7f';
              __s = __s + 1;
              cVar4 = cVar4 + 'v';
              cVar6 = cVar6 + 'v';
              iVar8 = iVar10 + iVar9;
              iVar10 = iVar10 + -0x8a;
            } while (0x8c < iVar8);
          }
          iVar10 = 0x8a;
          if (iVar3 < 0x8a) {
            iVar10 = iVar3;
          }
          iVar8 = 10;
          if (iVar3 < 10) {
            iVar8 = iVar3;
          }
          uVar5 = ((iVar3 - iVar10) + 0x89U) / 0x8a;
          uVar7 = ((iVar3 - iVar8) + 0x89U) / 0x8a;
          if (uVar5 < uVar7) {
            uVar7 = uVar5;
          }
          iVar10 = 2;
          if (iVar3 < 2) {
            iVar10 = iVar3;
          }
          uVar5 = ((iVar3 - iVar10) + 0x89U) / 0x8a;
          if (uVar5 <= uVar7) {
            uVar7 = uVar5;
          }
          iVar3 = uVar7 * -0x8a + iVar3;
          if (iVar3 < 2) {
            iVar3 = 1;
          }
          memset(__s,0,(ulong)(uint)(iVar3 * 2));
          pHVar14 = pHVar14 + (ulong)(iVar3 - 1) + (ulong)uVar7 + 1;
        }
      }
      else {
        if (uVar12 != uVar13) {
          pHVar14->code = uVar13;
          pHVar14->extra_bits = '\0';
          pHVar14 = pHVar14 + 1;
          iVar3 = iVar3 + -1;
        }
        if (0 < iVar3) {
          iVar10 = iVar3;
          if (2 < iVar3) {
            do {
              pHVar14->code = '\x10';
              if (iVar10 < 7) {
                pHVar14->extra_bits = (char)iVar10 + 0xfd;
                pHVar14 = pHVar14 + 1;
                goto LAB_00170462;
              }
              pHVar14->extra_bits = '\x03';
              pHVar14 = pHVar14 + 1;
              iVar3 = iVar10 + -6;
              bVar2 = 8 < iVar10;
              iVar10 = iVar3;
            } while (bVar2);
          }
          if (0 < iVar3) {
            do {
              pHVar14->code = uVar13;
              pHVar14->extra_bits = '\0';
              pHVar14 = pHVar14 + 1;
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
        }
      }
LAB_00170462:
      iVar10 = iVar9;
      uVar12 = uVar13;
    } while (iVar9 < iVar1);
  }
  return (int)((ulong)((long)pHVar14 - (long)tokens) >> 1);
}

Assistant:

int VP8LCreateCompressedHuffmanTree(const HuffmanTreeCode* const tree,
                                    HuffmanTreeToken* tokens, int max_tokens) {
  HuffmanTreeToken* const starting_token = tokens;
  HuffmanTreeToken* const ending_token = tokens + max_tokens;
  const int depth_size = tree->num_symbols;
  int prev_value = 8;  // 8 is the initial value for rle.
  int i = 0;
  assert(tokens != NULL);
  while (i < depth_size) {
    const int value = tree->code_lengths[i];
    int k = i + 1;
    int runs;
    while (k < depth_size && tree->code_lengths[k] == value) ++k;
    runs = k - i;
    if (value == 0) {
      tokens = CodeRepeatedZeros(runs, tokens);
    } else {
      tokens = CodeRepeatedValues(runs, tokens, value, prev_value);
      prev_value = value;
    }
    i += runs;
    assert(tokens <= ending_token);
  }
  (void)ending_token;    // suppress 'unused variable' warning
  return (int)(tokens - starting_token);
}